

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O0

void __thiscall DIS::IntercomControlPdu::~IntercomControlPdu(IntercomControlPdu *this)

{
  IntercomControlPdu *this_local;
  
  (this->super_RadioCommunicationsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__IntercomControlPdu_00272470;
  std::
  vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
  ::clear(&this->_intercomParameters);
  std::
  vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
  ::~vector(&this->_intercomParameters);
  EntityID::~EntityID(&this->_masterEntityID);
  EntityID::~EntityID(&this->_sourceEntityID);
  RadioCommunicationsFamilyPdu::~RadioCommunicationsFamilyPdu
            (&this->super_RadioCommunicationsFamilyPdu);
  return;
}

Assistant:

IntercomControlPdu::~IntercomControlPdu()
{
    _intercomParameters.clear();
}